

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O0

bool __thiscall OSSLEVPCMacAlgorithm::signInit(OSSLEVPCMacAlgorithm *this,SymmetricKey *key)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CMAC_CTX *pCVar3;
  uchar *key_00;
  size_t keylen;
  ulong e;
  char *pcVar4;
  SymmetricKey *in_RSI;
  MacAlgorithm *in_RDI;
  ByteString dummy_1;
  ByteString dummy;
  EVP_CIPHER *cipher;
  ByteString *in_stack_ffffffffffffff48;
  ByteString local_80;
  ByteString local_48;
  EVP_CIPHER *local_20;
  SymmetricKey *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = MacAlgorithm::signInit(in_RDI,in_RSI);
  if (bVar1) {
    iVar2 = (*in_RDI->_vptr_MacAlgorithm[0xc])();
    local_20 = (EVP_CIPHER *)CONCAT44(extraout_var,iVar2);
    if (local_20 == (EVP_CIPHER *)0x0) {
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                 ,0x3c,"Invalid sign mac algorithm");
      ByteString::ByteString((ByteString *)0x1b90a5);
      MacAlgorithm::signFinal(in_RDI,&local_48);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x1b90c8);
    }
    else {
      pCVar3 = CMAC_CTX_new();
      in_RDI[1]._vptr_MacAlgorithm = (_func_int **)pCVar3;
      if (in_RDI[1]._vptr_MacAlgorithm == (_func_int **)0x0) {
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                   ,0x48,"Failed to allocate space for CMAC_CTX");
        local_1 = 0;
      }
      else {
        pCVar3 = (CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
        (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        key_00 = ByteString::const_byte_str(in_stack_ffffffffffffff48);
        (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        keylen = ByteString::size((ByteString *)0x1b9174);
        iVar2 = CMAC_Init(pCVar3,key_00,keylen,local_20,(ENGINE *)0x0);
        if (iVar2 == 0) {
          e = ERR_get_error();
          pcVar4 = ERR_error_string(e,(char *)0x0);
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                     ,0x50,"CMAC_Init failed: %s",pcVar4);
          CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
          in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
          ByteString::ByteString((ByteString *)0x1b9206);
          MacAlgorithm::signFinal(in_RDI,&local_80);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1b9229);
        }
        else {
          local_1 = 1;
        }
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPCMacAlgorithm::signInit(const SymmetricKey* key)
{
	// Call the superclass initialiser
	if (!MacAlgorithm::signInit(key))
	{
		return false;
	}

	// Determine the cipher class
	const EVP_CIPHER* cipher = getEVPCipher();
	if (cipher == NULL)
	{
		ERROR_MSG("Invalid sign mac algorithm");

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	// Initialize the context
	curCTX = CMAC_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for CMAC_CTX");

		return false;
	}

	// Initialize EVP signing
	if (!CMAC_Init(curCTX, key->getKeyBits().const_byte_str(), key->getKeyBits().size(), cipher, NULL))
	{
		ERROR_MSG("CMAC_Init failed: %s", ERR_error_string(ERR_get_error(), NULL));

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}